

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_specialization_info(Hasher *h,VkSpecializationInfo *spec)

{
  uint local_1c;
  uint32_t i;
  VkSpecializationInfo *spec_local;
  Hasher *h_local;
  
  Hasher::data<unsigned_char>(h,(uchar *)spec->pData,spec->dataSize);
  Hasher::u64(h,spec->dataSize);
  Hasher::u32(h,spec->mapEntryCount);
  for (local_1c = 0; local_1c < spec->mapEntryCount; local_1c = local_1c + 1) {
    Hasher::u32(h,spec->pMapEntries[local_1c].offset);
    Hasher::u64(h,spec->pMapEntries[local_1c].size);
    Hasher::u32(h,spec->pMapEntries[local_1c].constantID);
  }
  return;
}

Assistant:

static void hash_specialization_info(Hasher &h, const VkSpecializationInfo &spec)
{
	h.data(static_cast<const uint8_t *>(spec.pData), spec.dataSize);
	h.u64(spec.dataSize);
	h.u32(spec.mapEntryCount);
	for (uint32_t i = 0; i < spec.mapEntryCount; i++)
	{
		h.u32(spec.pMapEntries[i].offset);
		h.u64(spec.pMapEntries[i].size);
		h.u32(spec.pMapEntries[i].constantID);
	}
}